

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

float __thiscall SVGChart::LogTickIterator::RoundUp(LogTickIterator *this,float inFloat)

{
  float inBase;
  float fVar1;
  undefined4 extraout_XMM0_Db;
  double dVar2;
  __type _Var3;
  int thePow;
  float theLogFac;
  float theBase;
  float inFloat_local;
  LogTickIterator *this_local;
  
  inBase = ((this->super_TickIterator).mAxisSetup)->mLogBase;
  fVar1 = SafeLog(inFloat,inBase,1.0);
  dVar2 = std::ceil((double)CONCAT44(extraout_XMM0_Db,fVar1));
  _Var3 = std::pow<float,int>(inBase,(int)SUB84(dVar2,0));
  return (float)_Var3;
}

Assistant:

float LogTickIterator::RoundUp (float inFloat) const {
      float theBase = mAxisSetup->mLogBase;
      float theLogFac = 1;//mAxisSetup->mLogFactor;
      int thePow = (int)ceil(SafeLog(inFloat, theBase, theLogFac));
      return pow (theBase, thePow);
    }